

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O2

void aom_highbd_ssim_parms_8x8_c
               (uint16_t *s,int sp,uint16_t *r,int rp,uint32_t *sum_s,uint32_t *sum_r,
               uint32_t *sum_sq_s,uint32_t *sum_sq_r,uint32_t *sum_sxr)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  
  for (iVar3 = 0; iVar3 != 8; iVar3 = iVar3 + 1) {
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      uVar1 = s[lVar4];
      *sum_s = *sum_s + (uint)uVar1;
      uVar2 = r[lVar4];
      uVar5 = (uint)uVar2;
      *sum_r = *sum_r + uVar5;
      *sum_sq_s = *sum_sq_s + (uint)uVar1 * (uint)uVar1;
      *sum_sq_r = *sum_sq_r + uVar5 * uVar5;
      *sum_sxr = *sum_sxr + (uint)uVar2 * (uint)uVar1;
    }
    r = r + rp;
    s = s + sp;
  }
  return;
}

Assistant:

void aom_highbd_ssim_parms_8x8_c(const uint16_t *s, int sp, const uint16_t *r,
                                 int rp, uint32_t *sum_s, uint32_t *sum_r,
                                 uint32_t *sum_sq_s, uint32_t *sum_sq_r,
                                 uint32_t *sum_sxr) {
  int i, j;
  for (i = 0; i < 8; i++, s += sp, r += rp) {
    for (j = 0; j < 8; j++) {
      *sum_s += s[j];
      *sum_r += r[j];
      *sum_sq_s += s[j] * s[j];
      *sum_sq_r += r[j] * r[j];
      *sum_sxr += s[j] * r[j];
    }
  }
}